

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.hpp
# Opt level: O3

string * __thiscall
lightconf::token_name_abi_cxx11_(string *__return_storage_ptr__,lightconf *this,token *tok)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  char *pcVar5;
  char *pcVar6;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  switch(*(undefined4 *)this) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "<none>";
    pcVar5 = "";
    break;
  case 1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "string";
    pcVar5 = "";
    break;
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "identifier";
    pcVar5 = "";
    break;
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "number";
    pcVar5 = "";
    break;
  case 4:
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct((ulong)local_38,'\x01');
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_38,0,(char *)0x0,0x11a881);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_48 = *plVar3;
      lStack_40 = plVar2[3];
      local_58 = &local_48;
    }
    else {
      local_48 = *plVar3;
      local_58 = (long *)*plVar2;
    }
    local_50 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_58);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar4) {
      lVar1 = plVar2[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    }
    __return_storage_ptr__->_M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_58 != &local_48) {
      operator_delete(local_58);
    }
    if (local_38[0] == local_28) {
      return __return_storage_ptr__;
    }
    operator_delete(local_38[0]);
    return __return_storage_ptr__;
  case 5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "whitespace";
    pcVar5 = "";
    break;
  case 6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "comment";
    pcVar5 = "";
    break;
  case 7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "eof";
    pcVar5 = "";
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "<unknown>";
    pcVar5 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar6,pcVar5);
  return __return_storage_ptr__;
}

Assistant:

inline std::string token_name(const token& tok) {
    switch (tok.type) {
    case token_type::none_token: return "<none>";
    case token_type::identifier_token: return "identifier";
    case token_type::string_token: return "string";
    case token_type::number_token: return "number";
    case token_type::char_token: return "'" + std::string(1, tok.char_value) + "'";
    case token_type::comment_token: return "comment";
    case token_type::whitespace_token: return "whitespace";
    case token_type::eof_token: return "eof";
    default: return "<unknown>";
    }
}